

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parameters.cpp
# Opt level: O2

ssize_t __thiscall
ezc3d::ParametersNS::Parameters::write(Parameters *this,int __fd,void *__buf,size_t __n)

{
  bool bVar1;
  Group *this_00;
  uint uVar2;
  undefined4 in_register_00000034;
  Header *in_R8;
  size_t i;
  ulong idx;
  char *pcVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  int local_58;
  int local_40;
  int processorType;
  int blankValue;
  int checksum;
  
  prepareCopyForWriting
            (this,(Parameters *)CONCAT44(in_register_00000034,__fd),in_R8,(WRITE_FORMAT *)__n);
  pcVar3 = (char *)((long)__buf + 0x10);
  std::ostream::write(pcVar3,(long)this);
  checksum = 0x50;
  std::ostream::write(pcVar3,(long)&checksum);
  auVar4 = std::istream::tellg();
  blankValue = 0;
  std::ostream::write(pcVar3,(long)&blankValue);
  processorType = 0x54;
  std::ostream::write(pcVar3,(long)&processorType);
  uVar2 = 0xffffffff;
  for (idx = 0; idx < (ulong)(((long)(this->_groups).
                                     super__Vector_base<ezc3d::ParametersNS::GroupNS::Group,_std::allocator<ezc3d::ParametersNS::GroupNS::Group>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                              (long)(this->_groups).
                                    super__Vector_base<ezc3d::ParametersNS::GroupNS::Group,_std::allocator<ezc3d::ParametersNS::GroupNS::Group>_>
                                    ._M_impl.super__Vector_impl_data._M_start) / 0x60);
      idx = idx + 1) {
    this_00 = group(this,idx);
    bVar1 = GroupNS::Group::isEmpty(this_00);
    if (!bVar1) {
      GroupNS::Group::write(this_00,(int)__buf,(void *)(ulong)uVar2,__n);
    }
    uVar2 = uVar2 - 1;
  }
  ezc3d::c3d::moveCursorToANewBlock((fstream *)__buf);
  std::istream::tellg();
  auVar5 = std::istream::tellg();
  std::istream::seekg(__buf,auVar4._0_8_,auVar4._8_8_);
  local_58 = auVar4._0_4_;
  uVar2 = (auVar5._0_4_ - local_58) - 2;
  local_40 = (uint)(0 < (int)(uVar2 & 0x800001ff)) + (int)uVar2 / 0x200;
  std::ostream::write(pcVar3,(long)&local_40);
  std::istream::seekg(__buf,auVar5._0_8_,auVar5._8_8_);
  return (ssize_t)this;
}

Assistant:

ezc3d::ParametersNS::Parameters ezc3d::ParametersNS::Parameters::write(
    std::fstream &f, ezc3d::DataStartInfo &dataStartPositionToFill,
    const ezc3d::Header &header, const ezc3d::WRITE_FORMAT &format) const {
  ezc3d::ParametersNS::Parameters p(prepareCopyForWriting(header, format));

  // Write the header of parameters
  f.write(reinterpret_cast<const char *>(&p._parametersStart), ezc3d::BYTE);
  int checksum(0x50);
  f.write(reinterpret_cast<const char *>(&checksum), ezc3d::BYTE);
  // Leave a blank space which will be later fill
  // (number of block can't be known before writing them)
  std::streampos pos(f.tellg()); // remember where to input this value later
  int blankValue(0);
  f.write(reinterpret_cast<const char *>(&blankValue), ezc3d::BYTE);
  int processorType = PROCESSOR_TYPE::INTEL;
  f.write(reinterpret_cast<const char *>(&processorType), ezc3d::BYTE);

  // Write each groups
  for (size_t i = 0; i < p.nbGroups(); ++i) {
    const ezc3d::ParametersNS::GroupNS::Group &currentGroup(p.group(i));
    if (!currentGroup.isEmpty())
      currentGroup.write(f, -static_cast<int>(i + 1), dataStartPositionToFill);
  }

  // Move the cursor to a beginning of a block
  ezc3d::c3d::moveCursorToANewBlock(f);
  // Go back at the left blank space (next parameter position in the last
  // parameter) and write the current position
  std::streampos currentPos(f.tellg());
  currentPos = f.tellg();
  f.seekg(pos);
  int nBlocksToNext = int(currentPos - pos - 2) / 512;
  if (int(currentPos - pos - 2) % 512 > 0)
    ++nBlocksToNext;
  f.write(reinterpret_cast<const char *>(&nBlocksToNext), ezc3d::BYTE);

  // Go back to where to start writing the data
  f.seekg(currentPos);

  return p;
}